

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O2

EStatusCodeAndObjectIDType __thiscall
PDFDocumentHandler::CopyObject(PDFDocumentHandler *this,ObjectIDType inSourceObjectID)

{
  EStatusCode EVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  EStatusCodeAndObjectIDType EVar5;
  ObjectIDTypeList anObjectList;
  ObjectIDType local_38;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  local_38 = inSourceObjectID;
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::find(&(this->mSourceToTarget)._M_t,&local_38);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->mSourceToTarget)._M_t._M_impl.super__Rb_tree_header) {
    local_30._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
    local_30._M_impl._M_node._M_size = 0;
    local_30._M_impl._M_node.super__List_node_base._M_prev =
         local_30._M_impl._M_node.super__List_node_base._M_next;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
               local_30._M_impl._M_node.super__List_node_base._M_next,&local_38);
    EVar1 = WriteNewObjects(this,(ObjectIDTypeList *)&local_30);
    pmVar3 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](&this->mSourceToTarget,&local_38);
    p_Var4 = (_Base_ptr)*pmVar3;
    std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear(&local_30);
  }
  else {
    p_Var4 = iVar2._M_node[1]._M_parent;
    EVar1 = eSuccess;
  }
  EVar5._4_4_ = 0;
  EVar5.first = EVar1;
  EVar5.second = (unsigned_long)p_Var4;
  return EVar5;
}

Assistant:

EStatusCodeAndObjectIDType PDFDocumentHandler::CopyObject(ObjectIDType inSourceObjectID)
{
	EStatusCodeAndObjectIDType result;

	ObjectIDTypeToObjectIDTypeMap::iterator it = mSourceToTarget.find(inSourceObjectID);
	if(it == mSourceToTarget.end())
	{
		ObjectIDTypeList anObjectList;
		anObjectList.push_back(inSourceObjectID);
		result.first = WriteNewObjects(anObjectList);
		result.second = mSourceToTarget[inSourceObjectID];
	}
	else
	{
		result.first = PDFHummus::eSuccess;
		result.second = it->second;
	}
	return result;
}